

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interrupts.c
# Opt level: O3

void check_interrupt(interrupt_queues *interrupt,uint64_t diff,uint32_t buf_index,uint32_t buf_size)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  
  uVar1 = (interrupt->moving_avg).index;
  uVar3 = interrupt->rx_pkts / (diff / 1000000);
  uVar5 = ((interrupt->moving_avg).sum - (interrupt->moving_avg).measured_rates[uVar1]) + uVar3;
  (interrupt->moving_avg).measured_rates[uVar1] = uVar3;
  (interrupt->moving_avg).sum = uVar5;
  uVar2 = (interrupt->moving_avg).length;
  if (uVar2 < 5) {
    uVar2 = uVar2 + 1;
    (interrupt->moving_avg).length = uVar2;
  }
  (interrupt->moving_avg).index = (uVar1 + 1) % 5;
  interrupt->rx_pkts = 0;
  if ((uVar5 / uVar2 < 0x4b1) && (buf_index != buf_size)) {
    interrupt->interrupt_enabled = true;
  }
  else {
    interrupt->interrupt_enabled = false;
  }
  uVar4 = monotonic_time();
  interrupt->last_time_checked = uVar4;
  return;
}

Assistant:

void check_interrupt(struct interrupt_queues* interrupt, uint64_t diff, uint32_t buf_index, uint32_t buf_size) {
	struct interrupt_moving_avg* avg = &interrupt->moving_avg;
	avg->sum -= avg->measured_rates[avg->index];
	avg->measured_rates[avg->index] = ppms(interrupt->rx_pkts, diff);
	avg->sum += avg->measured_rates[avg->index];
	if (avg->length < MOVING_AVERAGE_RANGE) {
		avg->length++;
	}
	avg->index = (avg->index + 1) % MOVING_AVERAGE_RANGE;
	interrupt->rx_pkts = 0;
	uint64_t average = avg->sum / avg->length;
	if (average > INTERRUPT_THRESHOLD) {
		interrupt->interrupt_enabled = false;
	} else if (buf_index == buf_size) {
		interrupt->interrupt_enabled = false;
	} else {
		interrupt->interrupt_enabled = true;
	}
	interrupt->last_time_checked = monotonic_time();
}